

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O3

void __thiscall CCharacterCore::Read(CCharacterCore *this,CNetObj_CharacterCore *pObjCore)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  (this->m_Pos).field_0.x = (float)pObjCore->m_X;
  (this->m_Pos).field_1.y = (float)pObjCore->m_Y;
  (this->m_Vel).field_0.x = (float)pObjCore->m_VelX * 0.00390625;
  (this->m_Vel).field_1.y = (float)pObjCore->m_VelY * 0.00390625;
  uVar1 = pObjCore->m_HookState;
  uVar4 = pObjCore->m_HookTick;
  (this->m_HookPos).field_0.x = (float)pObjCore->m_HookX;
  (this->m_HookPos).field_1.y = (float)pObjCore->m_HookY;
  (this->m_HookDir).field_0.x = (float)pObjCore->m_HookDx * 0.00390625;
  (this->m_HookDir).field_1.y = (float)pObjCore->m_HookDy * 0.00390625;
  uVar2 = pObjCore->m_Jumped;
  uVar5 = pObjCore->m_HookedPlayer;
  this->m_HookTick = uVar4;
  this->m_HookState = uVar1;
  this->m_HookedPlayer = uVar5;
  this->m_Jumped = uVar2;
  uVar3 = pObjCore->m_Angle;
  uVar6 = pObjCore->m_Direction;
  this->m_Direction = uVar6;
  this->m_Angle = uVar3;
  return;
}

Assistant:

void CCharacterCore::Read(const CNetObj_CharacterCore *pObjCore)
{
	m_Pos.x = pObjCore->m_X;
	m_Pos.y = pObjCore->m_Y;
	m_Vel.x = pObjCore->m_VelX/256.0f;
	m_Vel.y = pObjCore->m_VelY/256.0f;
	m_HookState = pObjCore->m_HookState;
	m_HookTick = pObjCore->m_HookTick;
	m_HookPos.x = pObjCore->m_HookX;
	m_HookPos.y = pObjCore->m_HookY;
	m_HookDir.x = pObjCore->m_HookDx/256.0f;
	m_HookDir.y = pObjCore->m_HookDy/256.0f;
	m_HookedPlayer = pObjCore->m_HookedPlayer;
	m_Jumped = pObjCore->m_Jumped;
	m_Direction = pObjCore->m_Direction;
	m_Angle = pObjCore->m_Angle;
}